

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::set_color
          (ansicolor_sink<spdlog::details::console_nullmutex> *this,level_enum color_level,
          string_view_t color)

{
  reference this_00;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
  *in_RDI;
  lock_guard<spdlog::details::null_mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  string local_48 [32];
  string_view_t *in_stack_ffffffffffffffd8;
  
  std::lock_guard<spdlog::details::null_mutex>::lock_guard
            ((lock_guard<spdlog::details::null_mutex> *)in_RDI,in_stack_ffffffffffffff98);
  to_string__abi_cxx11_(in_stack_ffffffffffffffd8);
  this_00 = std::
            array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
            ::operator[](in_RDI,(size_type)in_stack_ffffffffffffff98);
  std::__cxx11::string::operator=((string *)this_00,local_48);
  std::__cxx11::string::~string(local_48);
  std::lock_guard<spdlog::details::null_mutex>::~lock_guard
            ((lock_guard<spdlog::details::null_mutex> *)0x1a047b);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color(level::level_enum color_level, string_view_t color)
{
    std::lock_guard<mutex_t> lock(mutex_);
    colors_[color_level] = to_string_(color);
}